

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avs2d_rkv.c
# Opt level: O0

MPP_RET hal_avs2d_rkv_dump_stream(void *hal,HalTaskInfo *task)

{
  void *__ptr;
  size_t __n;
  void *base;
  MppBuffer buffer;
  char name [50];
  FILE *fp_stream;
  Avs2dHalCtx_t *p_hal;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  stack0xffffffffffffffd0 = (FILE *)0x0;
  base = (void *)0x0;
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x18),(task->dec).input,SLOT_BUFFER,&base);
  __ptr = mpp_buffer_get_ptr_with_caller(base,"hal_avs2d_rkv_dump_stream");
  snprintf((char *)&buffer,0x32,"/data/tmp/rkv_stream_in_%03d.bin",
           (ulong)*(uint *)((long)hal + 0x5c0));
  register0x00000000 = fopen((char *)&buffer,"wb");
  __n = mpp_packet_get_length((task->dec).input_packet);
  fwrite(__ptr,1,__n,stack0xffffffffffffffd0);
  fclose(stack0xffffffffffffffd0);
  return MPP_OK;
}

Assistant:

static MPP_RET hal_avs2d_rkv_dump_stream(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    Avs2dHalCtx_t *p_hal = (Avs2dHalCtx_t *)hal;

    FILE *fp_stream = NULL;
    char name[50];
    MppBuffer buffer = NULL;
    void *base = NULL;
    mpp_buf_slot_get_prop(p_hal->packet_slots, task->dec.input, SLOT_BUFFER, &buffer);
    base = mpp_buffer_get_ptr(buffer);
    snprintf(name, sizeof(name), "/data/tmp/rkv_stream_in_%03d.bin", p_hal->frame_no);
    fp_stream = fopen(name, "wb");
    fwrite(base, 1, mpp_packet_get_length(task->dec.input_packet), fp_stream);
    fclose(fp_stream);

    return ret;
}